

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::FenceGLImpl::DeviceWait(FenceGLImpl *this,Uint64 Value)

{
  PFNGLWAITSYNCPROC p_Var1;
  bool bVar2;
  pointer ppVar3;
  GLsync p_Var4;
  iterator local_58;
  undefined1 local_38 [8];
  iterator Iter;
  Uint64 Value_local;
  FenceGLImpl *this_local;
  
  Iter._M_node = (_Map_pointer)Value;
  std::
  deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
  ::begin((iterator *)local_38,&this->m_PendingFences);
  while( true ) {
    std::
    deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
    ::end(&local_58,&this->m_PendingFences);
    bVar2 = std::operator!=((_Self *)local_38,&local_58);
    if (!bVar2) {
      return;
    }
    ppVar3 = std::
             _Deque_iterator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_&,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_*>
             ::operator->((_Deque_iterator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_&,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_*>
                           *)local_38);
    p_Var1 = __glewWaitSync;
    if (Iter._M_node <= (_Map_pointer)ppVar3->first) break;
    std::
    _Deque_iterator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_&,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_*>
    ::operator++((_Deque_iterator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_&,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_*>
                  *)local_38);
  }
  ppVar3 = std::
           _Deque_iterator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_&,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_*>
           ::operator->((_Deque_iterator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_&,_std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_*>
                         *)local_38);
  p_Var4 = GLObjectWrappers::GLSyncObj::operator_cast_to___GLsync_(&ppVar3->second);
  (*p_Var1)(p_Var4,0,0xffffffffffffffff);
  return;
}

Assistant:

void FenceGLImpl::DeviceWait(Uint64 Value)
{
    auto Iter = m_PendingFences.begin();
    for (; Iter != m_PendingFences.end(); ++Iter)
    {
        if (Iter->first >= Value)
        {
            glWaitSync(Iter->second, 0, GL_TIMEOUT_IGNORED);
            return;
        }
    }
}